

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void __thiscall
Hpipe::Instruction::apply(Instruction *this,function<void_(Hpipe::Instruction_*)> *f,bool subgraphs)

{
  function<void_(Hpipe::Instruction_*)> local_40;
  byte local_19;
  function<void_(Hpipe::Instruction_*)> *pfStack_18;
  bool subgraphs_local;
  function<void_(Hpipe::Instruction_*)> *f_local;
  Instruction *this_local;
  
  cur_op_id = cur_op_id + 1;
  local_19 = subgraphs;
  pfStack_18 = f;
  f_local = (function<void_(Hpipe::Instruction_*)> *)this;
  std::function<void_(Hpipe::Instruction_*)>::function(&local_40,f);
  (*this->_vptr_Instruction[6])(this,&local_40,(ulong)(local_19 & 1));
  std::function<void_(Hpipe::Instruction_*)>::~function(&local_40);
  return;
}

Assistant:

void Instruction::apply( std::function<void (Instruction *)> f, bool subgraphs ) {
    ++cur_op_id;
    apply_rec( f, subgraphs );
}